

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_linear_resampler_set_rate_internal
                    (ma_linear_resampler *pResampler,void *pHeap,
                    ma_linear_resampler_heap_layout *pHeapLayout,ma_uint32 sampleRateIn,
                    ma_uint32 sampleRateOut,ma_bool32 isResamplerAlreadyInitialized)

{
  ma_uint32 mVar1;
  uint local_b0;
  ma_uint32 local_ac;
  undefined1 local_98 [16];
  double local_88;
  double local_80;
  ma_uint32 local_74;
  undefined1 auStack_70 [4];
  ma_uint32 oldSampleRateOut;
  ma_lpf_config lpfConfig;
  double lpfCutoffFrequency;
  ma_uint32 lpfSampleRate;
  ma_uint32 gcf;
  ma_result result;
  ma_bool32 isResamplerAlreadyInitialized_local;
  ma_uint32 sampleRateOut_local;
  ma_uint32 sampleRateIn_local;
  ma_linear_resampler_heap_layout *pHeapLayout_local;
  void *pHeap_local;
  ma_linear_resampler *pResampler_local;
  uint local_10;
  ma_uint32 t;
  
  if (pResampler == (ma_linear_resampler *)0x0) {
    pResampler_local._0_4_ = MA_INVALID_ARGS;
  }
  else if ((sampleRateIn == 0) || (sampleRateOut == 0)) {
    pResampler_local._0_4_ = MA_INVALID_ARGS;
  }
  else {
    local_74 = (pResampler->config).sampleRateOut;
    (pResampler->config).sampleRateIn = sampleRateIn;
    (pResampler->config).sampleRateOut = sampleRateOut;
    t = (pResampler->config).sampleRateIn;
    for (local_10 = (pResampler->config).sampleRateOut; mVar1 = t, local_10 != 0;
        local_10 = mVar1 % local_10) {
      t = local_10;
    }
    (pResampler->config).sampleRateIn = (pResampler->config).sampleRateIn / t;
    (pResampler->config).sampleRateOut = (pResampler->config).sampleRateOut / t;
    if ((pResampler->config).lpfOrder < 9) {
      if ((pResampler->config).sampleRateOut < (pResampler->config).sampleRateIn) {
        local_ac = (pResampler->config).sampleRateIn;
      }
      else {
        local_ac = (pResampler->config).sampleRateOut;
      }
      if ((pResampler->config).sampleRateIn < (pResampler->config).sampleRateOut) {
        local_b0 = (pResampler->config).sampleRateIn;
      }
      else {
        local_b0 = (pResampler->config).sampleRateOut;
      }
      lpfConfig._24_8_ = (double)local_b0 * 0.5 * (pResampler->config).lpfNyquistFactor;
      ma_lpf_config_init((ma_lpf_config *)local_98,(pResampler->config).format,
                         (pResampler->config).channels,local_ac,(double)lpfConfig._24_8_,
                         (pResampler->config).lpfOrder);
      auStack_70 = (undefined1  [4])local_98._0_4_;
      oldSampleRateOut = local_98._4_4_;
      lpfConfig.format = local_98._8_4_;
      lpfConfig.channels = local_98._12_4_;
      lpfConfig._8_8_ = local_88;
      lpfConfig.cutoffFrequency = local_80;
      if (isResamplerAlreadyInitialized == 0) {
        lpfSampleRate =
             ma_lpf_init_preallocated
                       ((ma_lpf_config *)auStack_70,(void *)((long)pHeap + pHeapLayout->lpfOffset),
                        &pResampler->lpf);
      }
      else {
        lpfSampleRate = ma_lpf_reinit((ma_lpf_config *)auStack_70,&pResampler->lpf);
      }
      if (lpfSampleRate == 0) {
        pResampler->inAdvanceInt =
             (pResampler->config).sampleRateIn / (pResampler->config).sampleRateOut;
        pResampler->inAdvanceFrac =
             (pResampler->config).sampleRateIn % (pResampler->config).sampleRateOut;
        ma_linear_resampler_adjust_timer_for_new_rate
                  (pResampler,local_74,(pResampler->config).sampleRateOut);
        pResampler_local._0_4_ = MA_SUCCESS;
      }
      else {
        pResampler_local._0_4_ = lpfSampleRate;
      }
    }
    else {
      pResampler_local._0_4_ = MA_INVALID_ARGS;
    }
  }
  return (ma_result)pResampler_local;
}

Assistant:

static ma_result ma_linear_resampler_set_rate_internal(ma_linear_resampler* pResampler, void* pHeap, ma_linear_resampler_heap_layout* pHeapLayout, ma_uint32 sampleRateIn, ma_uint32 sampleRateOut, ma_bool32 isResamplerAlreadyInitialized)
{
    ma_result result;
    ma_uint32 gcf;
    ma_uint32 lpfSampleRate;
    double lpfCutoffFrequency;
    ma_lpf_config lpfConfig;
    ma_uint32 oldSampleRateOut; /* Required for adjusting time advance down the bottom. */

    if (pResampler == NULL) {
        return MA_INVALID_ARGS;
    }

    if (sampleRateIn == 0 || sampleRateOut == 0) {
        return MA_INVALID_ARGS;
    }

    oldSampleRateOut = pResampler->config.sampleRateOut;

    pResampler->config.sampleRateIn  = sampleRateIn;
    pResampler->config.sampleRateOut = sampleRateOut;

    /* Simplify the sample rate. */
    gcf = ma_gcf_u32(pResampler->config.sampleRateIn, pResampler->config.sampleRateOut);
    pResampler->config.sampleRateIn  /= gcf;
    pResampler->config.sampleRateOut /= gcf;

    /* Always initialize the low-pass filter, even when the order is 0. */
    if (pResampler->config.lpfOrder > MA_MAX_FILTER_ORDER) {
        return MA_INVALID_ARGS;
    }

    lpfSampleRate      = (ma_uint32)(ma_max(pResampler->config.sampleRateIn, pResampler->config.sampleRateOut));
    lpfCutoffFrequency = (   double)(ma_min(pResampler->config.sampleRateIn, pResampler->config.sampleRateOut) * 0.5 * pResampler->config.lpfNyquistFactor);

    lpfConfig = ma_lpf_config_init(pResampler->config.format, pResampler->config.channels, lpfSampleRate, lpfCutoffFrequency, pResampler->config.lpfOrder);

    /*
    If the resampler is alreay initialized we don't want to do a fresh initialization of the low-pass filter because it will result in the cached frames
    getting cleared. Instead we re-initialize the filter which will maintain any cached frames.
    */
    if (isResamplerAlreadyInitialized) {
        result = ma_lpf_reinit(&lpfConfig, &pResampler->lpf);
    } else {
        result = ma_lpf_init_preallocated(&lpfConfig, ma_offset_ptr(pHeap, pHeapLayout->lpfOffset), &pResampler->lpf);
    }

    if (result != MA_SUCCESS) {
        return result;
    }


    pResampler->inAdvanceInt  = pResampler->config.sampleRateIn / pResampler->config.sampleRateOut;
    pResampler->inAdvanceFrac = pResampler->config.sampleRateIn % pResampler->config.sampleRateOut;

    /* Our timer was based on the old rate. We need to adjust it so that it's based on the new rate. */
    ma_linear_resampler_adjust_timer_for_new_rate(pResampler, oldSampleRateOut, pResampler->config.sampleRateOut);

    return MA_SUCCESS;
}